

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfx2wav.cc
# Opt level: O0

PBuffer __thiscall ConvertorSFX2WAV::create_data(ConvertorSFX2WAV *this,PBuffer *data)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *this_00;
  __shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar4;
  short local_48;
  int value;
  undefined1 local_30 [8];
  PMutableBuffer res;
  PBuffer *data_local;
  ConvertorSFX2WAV *this_local;
  
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)local_30);
  while( true ) {
    peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (in_RDX);
    bVar1 = Buffer::readable(peVar3);
    if (!bVar1) break;
    peVar3 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (in_RDX);
    bVar2 = Buffer::pop<unsigned_char>(peVar3);
    local_48 = (ushort)bVar2 +
               (short)*(undefined4 *)
                       &data[3].super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
    if (((ulong)data[3].super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
        0x100000000) != 0) {
      local_48 = 0xff - local_48;
    }
    local_48 = local_48 * 0xff;
    this_00 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
    MutableBuffer::push<short>(this_00,local_48,1);
  }
  std::shared_ptr<Buffer>::shared_ptr<MutableBuffer,void>
            ((shared_ptr<Buffer> *)this,(shared_ptr<MutableBuffer> *)local_30);
  std::shared_ptr<MutableBuffer>::~shared_ptr((shared_ptr<MutableBuffer> *)local_30);
  PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorSFX2WAV::create_data(PBuffer data) {
  PMutableBuffer res = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (data->readable()) {
    int value = data->pop<uint8_t>();
    value = value + level;
    if (invert) {
      value = 0xFF - value;
    }
    value *= 0xFF;
    res->push<int16_t>(value);
  }

  return res;
}